

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluk.c
# Opt level: O2

int fffstruint(char *input,long ntodo,double scale,double zero,long twidth,double implipower,
              int nullcheck,char *snull,uint nullval,char *nullarray,int *anynull,uint *output,
              int *status)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  size_t sVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  char message [81];
  
  sVar7 = strlen(snull);
  lVar10 = 0;
  if (ntodo < 1) {
    ntodo = lVar10;
  }
  do {
    if (lVar10 == ntodo) {
      return *status;
    }
    pbVar2 = (byte *)input + twidth;
    bVar3 = ((byte *)input)[twidth];
    ((byte *)input)[twidth] = 0;
    pbVar9 = (byte *)input;
    if ((*snull == '\x01') || (iVar6 = strncmp(snull,input,(long)(int)sVar7), iVar6 != 0)) {
      for (; bVar5 = *pbVar9, bVar5 == 0x20; pbVar9 = pbVar9 + 1) {
      }
      if ((bVar5 == 0x2b) || (bVar5 == 0x2d)) {
        do {
          pbVar1 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
        } while (*pbVar1 == 0x20);
        dVar12 = *(double *)(&DAT_00207830 + (ulong)(bVar5 == 0x2d) * 8);
        bVar5 = *pbVar1;
      }
      else {
        dVar12 = 1.0;
      }
      dVar13 = 0.0;
      while ((byte)(bVar5 - 0x30) < 10) {
        iVar6 = (int)(char)bVar5;
        do {
          bVar5 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
        } while (bVar5 == 0x20);
        dVar13 = dVar13 * 10.0 + (double)iVar6 + -48.0;
      }
      dVar11 = implipower;
      if ((bVar5 | 2) == 0x2e) {
        do {
          bVar5 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
        } while (bVar5 == 0x20);
        dVar11 = 1.0;
        while ((byte)(bVar5 - 0x30) < 10) {
          dVar13 = dVar13 * 10.0 + (double)(int)(char)bVar5 + -48.0;
          do {
            bVar5 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
          } while (bVar5 == 0x20);
          dVar11 = dVar11 * 10.0;
        }
      }
      iVar6 = 0;
      if ((bVar5 & 0xfe) == 0x44) {
        do {
          bVar5 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
        } while (bVar5 == 0x20);
        if ((bVar5 == 0x2d) || (bVar5 == 0x2b)) {
          do {
            pbVar1 = pbVar9 + 1;
            pbVar9 = pbVar9 + 1;
          } while (*pbVar1 == 0x20);
          iVar8 = (uint)(bVar5 != 0x2d) * 2 + -1;
          bVar5 = *pbVar1;
        }
        else {
          iVar8 = 1;
        }
        iVar6 = 0;
        while ((byte)(bVar5 - 0x30) < 10) {
          do {
            pbVar1 = pbVar9 + 1;
            pbVar9 = pbVar9 + 1;
          } while (*pbVar1 == 0x20);
          iVar6 = iVar6 * 10 + -0x30 + (uint)bVar5;
          bVar5 = *pbVar1;
        }
      }
      else {
        iVar8 = 1;
      }
      if (bVar5 != 0) {
        builtin_strncpy(message,"Cannot read number from ASCII table",0x24);
        ffpmsg(message);
        snprintf(message,0x51,"Column field = %s.",input);
        ffpmsg(message);
        *pbVar2 = bVar3;
        *status = 0x199;
        return 0x199;
      }
      dVar4 = pow(10.0,(double)(iVar8 * iVar6));
      dVar12 = dVar4 * ((dVar13 * dVar12) / dVar11) * scale + zero;
      input = (char *)pbVar9;
      if (-0.49 <= dVar12) {
        if (dVar12 <= 4294967295.49) {
          output[lVar10] = (uint)(long)dVar12;
        }
        else {
          *status = -0xb;
          output[lVar10] = 0xffffffff;
        }
      }
      else {
        *status = -0xb;
        output[lVar10] = 0;
      }
    }
    else {
      input = (char *)pbVar2;
      if (nullcheck != 0) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar10] = nullval;
        }
        else {
          nullarray[lVar10] = '\x01';
        }
      }
    }
    *pbVar2 = bVar3;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

int fffstruint(char *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            long twidth,          /* I - width of each substring of chars    */
            double implipower,    /* I - power of 10 of implied decimal      */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            char  *snull,         /* I - value of FITS null string, if any   */
   unsigned int nullval,          /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned int *output,          /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file. Check
  for null values and do scaling if required. The nullcheck code value
  determines how any null values in the input array are treated. A null
  value is an input pixel that is equal to snull.  If nullcheck= 0, then
  no special checking for nulls is performed.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    int nullen;
    long ii;
    double dvalue;
    char *cstring, message[FLEN_ERRMSG];
    char *cptr, *tpos;
    char tempstore, chrzero = '0';
    double val, power;
    int exponent, sign, esign, decpt;

    nullen = strlen(snull);
    cptr = input;  /* pointer to start of input string */
    for (ii = 0; ii < ntodo; ii++)
    {
      cstring = cptr;
      /* temporarily insert a null terminator at end of the string */
      tpos = cptr + twidth;
      tempstore = *tpos;
      *tpos = 0;

      /* check if null value is defined, and if the    */
      /* column string is identical to the null string */
      if (snull[0] != ASCII_NULL_UNDEFINED && 
         !strncmp(snull, cptr, nullen) )
      {
        if (nullcheck)  
        {
          *anynull = 1;    
          if (nullcheck == 1)
            output[ii] = nullval;
          else
            nullarray[ii] = 1;
        }
        cptr += twidth;
      }
      else
      {
        /* value is not the null value, so decode it */
        /* remove any embedded blank characters from the string */

        decpt = 0;
        sign = 1;
        val  = 0.;
        power = 1.;
        exponent = 0;
        esign = 1;

        while (*cptr == ' ')               /* skip leading blanks */
           cptr++;

        if (*cptr == '-' || *cptr == '+')  /* check for leading sign */
        {
          if (*cptr == '-')
             sign = -1;

          cptr++;

          while (*cptr == ' ')         /* skip blanks between sign and value */
            cptr++;
        }

        while (*cptr >= '0' && *cptr <= '9')
        {
          val = val * 10. + *cptr - chrzero;  /* accumulate the value */
          cptr++;

          while (*cptr == ' ')         /* skip embedded blanks in the value */
            cptr++;
        }

        if (*cptr == '.' || *cptr == ',')       /* check for decimal point */
        {
          decpt = 1;       /* set flag to show there was a decimal point */
          cptr++;
          while (*cptr == ' ')         /* skip any blanks */
            cptr++;

          while (*cptr >= '0' && *cptr <= '9')
          {
            val = val * 10. + *cptr - chrzero;  /* accumulate the value */
            power = power * 10.;
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks in the value */
              cptr++;
          }
        }

        if (*cptr == 'E' || *cptr == 'D')  /* check for exponent */
        {
          cptr++;
          while (*cptr == ' ')         /* skip blanks */
              cptr++;
  
          if (*cptr == '-' || *cptr == '+')  /* check for exponent sign */
          {
            if (*cptr == '-')
               esign = -1;

            cptr++;

            while (*cptr == ' ')        /* skip blanks between sign and exp */
              cptr++;
          }

          while (*cptr >= '0' && *cptr <= '9')
          {
            exponent = exponent * 10 + *cptr - chrzero;  /* accumulate exp */
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks */
              cptr++;
          }
        }

        if (*cptr  != 0)  /* should end up at the null terminator */
        {
          snprintf(message, FLEN_ERRMSG,"Cannot read number from ASCII table");
          ffpmsg(message);
          snprintf(message, FLEN_ERRMSG,"Column field = %s.", cstring);
          ffpmsg(message);
          /* restore the char that was overwritten by the null */
          *tpos = tempstore;
          return(*status = BAD_C2D);
        }

        if (!decpt)  /* if no explicit decimal, use implied */
           power = implipower;

        dvalue = (sign * val / power) * pow(10., (double) (esign * exponent));

        dvalue = dvalue * scale + zero;   /* apply the scaling */

        if (dvalue < DUINT_MIN)
        {
            *status = OVERFLOW_ERR;
            output[ii] = 0;
        }
        else if (dvalue > DUINT_MAX)
        {
            *status = OVERFLOW_ERR;
            output[ii] = UINT_MAX;
        }
        else
            output[ii] = (long) dvalue;
      }
      /* restore the char that was overwritten by the null */
      *tpos = tempstore;
    }
    return(*status);
}